

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,CRYPTO_BUFFER **certs,size_t num_certs)

{
  CRYPTO_BUFFER **ppCVar1;
  bool bVar2;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_50;
  ulong local_48;
  size_t i;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_30;
  size_t local_28;
  size_t num_certs_local;
  CRYPTO_BUFFER **certs_local;
  SSL_CREDENTIAL *cred_local;
  
  local_28 = num_certs;
  num_certs_local = (size_t)certs;
  certs_local = (CRYPTO_BUFFER **)cred;
  bVar2 = ssl_credential_st::UsesX509(cred);
  ppCVar1 = certs_local;
  if ((bVar2) && (local_28 != 0)) {
    bssl::UpRef((bssl *)&local_30,*(CRYPTO_BUFFER **)num_certs_local);
    bVar2 = ssl_credential_st::SetLeafCert
                      ((ssl_credential_st *)ppCVar1,(UniquePtr<CRYPTO_BUFFER> *)&local_30,false);
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      ssl_credential_st::ClearIntermediateCerts((ssl_credential_st *)certs_local);
      for (local_48 = 1; ppCVar1 = certs_local, local_48 < local_28; local_48 = local_48 + 1) {
        bssl::UpRef((bssl *)&local_50,*(CRYPTO_BUFFER **)(num_certs_local + local_48 * 8));
        bVar2 = ssl_credential_st::AppendIntermediateCert
                          ((ssl_credential_st *)ppCVar1,(UniquePtr<CRYPTO_BUFFER> *)&local_50);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return 0;
        }
      }
      cred_local._4_4_ = 1;
    }
    else {
      cred_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x17c);
    cred_local._4_4_ = 0;
  }
  return cred_local._4_4_;
}

Assistant:

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,
                                   CRYPTO_BUFFER *const *certs,
                                   size_t num_certs) {
  if (!cred->UsesX509() || num_certs == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!cred->SetLeafCert(UpRef(certs[0]), /*discard_key_on_mismatch=*/false)) {
    return 0;
  }

  cred->ClearIntermediateCerts();
  for (size_t i = 1; i < num_certs; i++) {
    if (!cred->AppendIntermediateCert(UpRef(certs[i]))) {
      return 0;
    }
  }

  return 1;
}